

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateOneofCaseDefinition
          (Generator *this,GeneratorOptions *options,Printer *printer,OneofDescriptor *oneof)

{
  bool bVar1;
  string *__return_storage_ptr__;
  OneofDescriptor *oneof_00;
  FieldDescriptor *field;
  OneofDescriptor *oneof_01;
  OneofDescriptor *oneof_02;
  int i;
  long lVar2;
  string sStack_98;
  string local_78;
  GeneratorOptions *local_58;
  string local_50;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(oneof + 0x10),
             (Descriptor *)oneof);
  (anonymous_namespace)::JSOneofName_abi_cxx11_(&sStack_98,(_anonymous_namespace_ *)oneof,oneof_00);
  __return_storage_ptr__ = &local_50;
  anon_unknown_0::ToEnumCase(__return_storage_ptr__,*(string **)oneof);
  local_58 = options;
  io::Printer::Print(printer,
                     "/**\n * @enum {number}\n */\n$classname$.$oneof$Case = {\n  $upcase$_NOT_SET: 0"
                     ,"classname",&local_78,"oneof",&sStack_98,"upcase",__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  for (lVar2 = 0; lVar2 < *(int *)(oneof + 0x1c); lVar2 = lVar2 + 1) {
    bVar1 = anon_unknown_0::IgnoreField(*(FieldDescriptor **)(*(long *)(oneof + 0x20) + lVar2 * 8));
    if (!bVar1) {
      anon_unknown_0::ToEnumCase
                (&local_78,(string *)**(undefined8 **)(*(long *)(oneof + 0x20) + lVar2 * 8));
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&sStack_98,*(_anonymous_namespace_ **)(*(long *)(oneof + 0x20) + lVar2 * 8),field);
      __return_storage_ptr__ = &local_78;
      io::Printer::Print(printer,",\n  $upcase$: $number$","upcase",&local_78,"number",&sStack_98);
      std::__cxx11::string::~string((string *)&sStack_98);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)local_58,*(GeneratorOptions **)(oneof + 0x10),
             (Descriptor *)__return_storage_ptr__);
  (anonymous_namespace)::JSOneofName_abi_cxx11_(&sStack_98,(_anonymous_namespace_ *)oneof,oneof_01);
  (anonymous_namespace)::JSOneofIndex_abi_cxx11_(&local_50,(_anonymous_namespace_ *)oneof,oneof_02);
  io::Printer::Print(printer,
                     "\n};\n\n/**\n * @return {$class$.$oneof$Case}\n */\n$class$.prototype.get$oneof$Case = function() {\n  return /** @type {$class$.$oneof$Case} */(jspb.Message.computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n};\n\n"
                     ,"class",&local_78,"oneof",&sStack_98,"oneofindex",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void Generator::GenerateOneofCaseDefinition(
    const GeneratorOptions& options,
    io::Printer* printer,
    const OneofDescriptor* oneof) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$classname$.$oneof$Case = {\n"
      "  $upcase$_NOT_SET: 0",
      "classname", GetMessagePath(options, oneof->containing_type()),
      "oneof", JSOneofName(oneof),
      "upcase", ToEnumCase(oneof->name()));

  for (int i = 0; i < oneof->field_count(); i++) {
    if (IgnoreField(oneof->field(i))) {
      continue;
    }

    printer->Print(
        ",\n"
        "  $upcase$: $number$",
        "upcase", ToEnumCase(oneof->field(i)->name()),
        "number", JSFieldIndex(oneof->field(i)));
  }

  printer->Print(
      "\n"
      "};\n"
      "\n"
      "/**\n"
      " * @return {$class$.$oneof$Case}\n"
      " */\n"
      "$class$.prototype.get$oneof$Case = function() {\n"
      "  return /** @type {$class$.$oneof$Case} */(jspb.Message."
      "computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n"
      "};\n"
      "\n",
      "class", GetMessagePath(options, oneof->containing_type()),
      "oneof", JSOneofName(oneof),
      "oneofindex", JSOneofIndex(oneof));
}